

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceAccessChainWith
          (InterfaceVariableScalarReplacement *this,Instruction *access_chain,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices,
          Instruction *scalar_var,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_component_values)

{
  uint uVar1;
  uint32_t uVar2;
  IRContext *this_00;
  DefUseManager *this_01;
  anon_class_48_6_2843ac58 local_a0;
  function<void_(spvtools::opt::Instruction_*)> local_70;
  uint32_t local_50;
  uint local_4c;
  undefined1 local_48 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  *loads_to_component_values_local;
  Instruction *scalar_var_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices_local;
  Instruction *access_chain_local;
  InterfaceVariableScalarReplacement *this_local;
  
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)loads_to_component_values;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  local_4c = 1;
  while( true ) {
    uVar1 = local_4c;
    uVar2 = Instruction::NumInOperands(access_chain);
    if (uVar2 <= uVar1) break;
    local_50 = Instruction::GetSingleWordInOperand(access_chain,local_4c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,&local_50);
    local_4c = local_4c + 1;
  }
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  local_a0.indexes = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48;
  local_a0.loads_to_component_values =
       (unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
        *)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  local_a0.this = this;
  local_a0.access_chain = access_chain;
  local_a0.interface_var_component_indices = interface_var_component_indices;
  local_a0.scalar_var = scalar_var;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::InterfaceVariableScalarReplacement::ReplaceAccessChainWith(spvtools::opt::Instruction*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,spvtools::opt::Instruction*,std::unordered_map<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>>*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_70,&local_a0);
  analysis::DefUseManager::ForEachUser(this_01,access_chain,&local_70);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::ReplaceAccessChainWith(
    Instruction* access_chain,
    const std::vector<uint32_t>& interface_var_component_indices,
    Instruction* scalar_var,
    std::unordered_map<Instruction*, Instruction*>* loads_to_component_values) {
  std::vector<uint32_t> indexes;
  for (uint32_t i = 1; i < access_chain->NumInOperands(); ++i) {
    indexes.push_back(access_chain->GetSingleWordInOperand(i));
  }

  // Note that we have a strong assumption that |access_chain| has only a single
  // index that is for the extra arrayness.
  context()->get_def_use_mgr()->ForEachUser(
      access_chain,
      [this, access_chain, &indexes, &interface_var_component_indices,
       scalar_var, loads_to_component_values](Instruction* user) {
        switch (user->opcode()) {
          case spv::Op::OpAccessChain: {
            UseBaseAccessChainForAccessChain(user, access_chain);
            ReplaceAccessChainWith(user, interface_var_component_indices,
                                   scalar_var, loads_to_component_values);
            return;
          }
          case spv::Op::OpStore: {
            uint32_t value_id = user->GetSingleWordInOperand(1);
            StoreComponentOfValueToAccessChainToScalarVar(
                value_id, interface_var_component_indices, scalar_var, indexes,
                user);
            return;
          }
          case spv::Op::OpLoad: {
            Instruction* value =
                LoadAccessChainToVar(scalar_var, indexes, user);
            loads_to_component_values->insert({user, value});
            return;
          }
          default:
            break;
        }
      });
}